

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

bool __thiscall miniros::RPCManager::start(RPCManager *this,int port)

{
  bool bVar1;
  int iVar2;
  ostream *__f;
  string *__args;
  ostream *poVar3;
  socklen_t in_ECX;
  undefined4 in_ESI;
  RPCManager *in_RDI;
  stringstream ss;
  bool enabled_1;
  bool enabled;
  char *in_stack_fffffffffffffcf8;
  Level level;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  _func_void_XmlRpcValue_ptr_XmlRpcValue_ptr *in_stack_fffffffffffffd08;
  function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *in_stack_fffffffffffffd10;
  string *this_00;
  undefined8 in_stack_fffffffffffffd20;
  Level level_00;
  string *in_stack_fffffffffffffd28;
  LogLocation *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  sockaddr *__addr;
  string local_268 [32];
  stringstream local_248 [16];
  ostream local_238 [24];
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  XmlRpcServer *in_stack_fffffffffffffde8;
  sockaddr local_c0 [2];
  allocator<char> local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator<char> local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38 [36];
  undefined4 local_14;
  byte local_1;
  
  level_00 = (Level)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  local_14 = in_ESI;
  bVar1 = std::thread::joinable
                    ((thread *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  if (bVar1) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    level = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    if (((start::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      console::initializeLogLocation(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,level_00);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    if (start::loc.level_ != Info) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),level)
      ;
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffd10);
    }
    local_4d = (start::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_4d) {
      console::print((FilterBase *)0x0,start::loc.logger_,(Level)(ulong)start::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                     ,0x7f,"bool miniros::RPCManager::start(int)","Manager is running at port %d",
                     in_RDI->port_);
    }
    local_1 = 1;
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((start(int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      console::initializeLogLocation(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,level_00);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    if (start(int)::loc.level_ != Info) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffd10);
    }
    local_72 = (start(int)::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_72) {
      in_ECX = 0x579523;
      in_stack_fffffffffffffcf8 = "Starting manager at port %d";
      console::print((FilterBase *)0x0,start(int)::loc.logger_,(Level)(ulong)start(int)::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                     ,0x83,"bool miniros::RPCManager::start(int)");
      in_stack_fffffffffffffd00 = local_14;
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x38,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (allocator<char> *)in_stack_fffffffffffffd30);
    __addr = local_c0;
    std::function<void(XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&)>::
    function<void(&)(XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&),void>
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    bind(in_RDI,(int)local_98,__addr,in_ECX);
    std::function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>::~function
              ((function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)0x4963e6);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    bVar1 = XmlRpc::XmlRpcServer::bindAndListen
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,in_stack_fffffffffffffde0
                      );
    if (bVar1) {
      iVar2 = XmlRpc::XmlRpcServer::get_port(&in_RDI->server_);
      in_RDI->port_ = iVar2;
      std::__cxx11::stringstream::stringstream(local_248);
      __f = std::operator<<(local_238,"http://");
      __args = network::getHost_abi_cxx11_();
      poVar3 = std::operator<<(__f,(string *)__args);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->port_);
      std::operator<<(poVar3,"/");
      std::__cxx11::stringstream::str();
      this_00 = local_268;
      std::__cxx11::string::operator=((string *)in_RDI,this_00);
      std::__cxx11::string::~string(this_00);
      std::thread::thread<void(miniros::RPCManager::*)(),miniros::RPCManager*,void>
                ((thread *)__addr,(type *)__f,(RPCManager **)__args);
      std::thread::operator=
                ((thread *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (thread *)in_stack_fffffffffffffcf8);
      std::thread::~thread((thread *)0x4965c9);
      local_1 = 1;
      std::__cxx11::stringstream::~stringstream(local_248);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RPCManager::start(int port)
{
  if (server_thread_.joinable()) {
    MINIROS_INFO("Manager is running at port %d", port_);
    return true;
  }

  MINIROS_INFO("Starting manager at port %d", port);
  shutting_down_ = false;
  bind("getPid", getPid);

  if (!server_.bindAndListen(port))
    return false;

  port_ = server_.get_port();
  MINIROS_ASSERT(port_ != 0);

  std::stringstream ss;
  ss << "http://" << network::getHost() << ":" << port_ << "/";
  uri_ = ss.str();

  server_thread_ = std::thread(&RPCManager::serverThreadFunc, this);
  return true;
}